

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  int local_50;
  int local_4c;
  int r;
  int b;
  AES_state column;
  int pos;
  AES_state rcon;
  int i;
  int nrounds_local;
  int nkeywords_local;
  uint8_t *key_local;
  AES_state *rounds_local;
  
  stack0xffffffffffffffcc = 1;
  column.slice[4] = 0;
  column.slice[5] = 0;
  rcon.slice[4] = 0;
  rcon.slice[5] = 0;
  for (; (int)rcon.slice._8_4_ < nrounds + 1; rcon.slice._8_4_ = rcon.slice._8_4_ + 1) {
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      rounds[(int)rcon.slice._8_4_].slice[local_4c] = 0;
    }
  }
  rcon.slice[4] = 0;
  rcon.slice[5] = 0;
  _nrounds_local = key;
  for (; (int)rcon.slice._8_4_ < nkeywords; rcon.slice._8_4_ = rcon.slice._8_4_ + 1) {
    for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
      LoadByte(rounds + ((int)rcon.slice._8_4_ >> 2),*_nrounds_local,local_50,rcon.slice._8_4_ & 3);
      _nrounds_local = _nrounds_local + 1;
    }
  }
  GetOneColumn((AES_state *)&r,rounds + (nkeywords + -1 >> 2),nkeywords - 1U & 3);
  for (rcon.slice._8_4_ = nkeywords; (int)rcon.slice._8_4_ < (nrounds + 1) * 4;
      rcon.slice._8_4_ = rcon.slice._8_4_ + 1) {
    if (column.slice._8_4_ == 0) {
      SubBytes((AES_state *)&r,0);
      KeySetupTransform((AES_state *)&r,(AES_state *)(column.slice + 6));
      MultX((AES_state *)(column.slice + 6));
    }
    else if ((6 < nkeywords) && (column.slice._8_4_ == 4)) {
      SubBytes((AES_state *)&r,0);
    }
    column.slice._8_4_ = column.slice._8_4_ + 1;
    if (column.slice._8_4_ == nkeywords) {
      column.slice[4] = 0;
      column.slice[5] = 0;
    }
    KeySetupColumnMix((AES_state *)&r,rounds + ((int)rcon.slice._8_4_ >> 2),
                      rounds + (rcon.slice._8_4_ - nkeywords >> 2),rcon.slice._8_4_ & 3,
                      rcon.slice._8_4_ - nkeywords & 3);
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}